

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O2

void anon_unknown.dwarf_4c4a0c::ProcRand(uchar *out,int num,RNGLevel level,bool always_use_real_rng)

{
  long lVar1;
  bool bVar2;
  RNGState *this;
  uint64_t uVar3;
  int i;
  int iVar4;
  Level LVar5;
  RNGState *pRVar7;
  CSHA512 *pCVar8;
  int iVar9;
  long in_FS_OFFSET;
  char cVar10;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  uint64_t out_1;
  CSHA512 startup_hasher;
  CSHA512 hasher;
  CSHA512 *pCVar6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = GetRNGState();
  if (0x20 < num) {
    __assert_fail("num <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
                  ,0x282,
                  "void (anonymous namespace)::ProcRand(unsigned char *, int, RNGLevel, bool)");
  }
  CSHA512::CSHA512(&hasher);
  if (level == PERIODIC) {
    pCVar8 = &hasher;
    SeedFast(pCVar8);
    SeedTimestamp(pCVar8);
    pCVar6 = pCVar8;
    RNGState::SeedEvents(this,pCVar8);
    uVar3 = hasher.bytes;
    LVar5 = (Level)pCVar6;
    RandAddDynamicEnv(pCVar8);
    bVar2 = LogAcceptCategory((LogFlags)pCVar8,LVar5);
    if (bVar2) {
      startup_hasher.s[0] = hasher.bytes - uVar3;
      logging_function._M_str = "SeedPeriodic";
      logging_function._M_len = 0xc;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
      ;
      source_file._M_len = 0x5a;
      LogPrintFormatInternal<unsigned_long>
                (logging_function,source_file,0x25d,RAND,Debug,(ConstevalFormatString<1U>)0x24c234,
                 startup_hasher.s);
    }
    SeedStrengthen(&hasher,this,(duration)0x989680);
  }
  else if (level == SLOW) {
    SeedSlow(&hasher,this);
  }
  else {
    SeedFast(&hasher);
  }
  bVar2 = RNGState::MixExtract(this,out,(long)num,&hasher,false,always_use_real_rng);
  if (!bVar2) {
    CSHA512::CSHA512(&startup_hasher);
    if ((anonymous_namespace)::g_rdseed_supported == '\x01') {
      for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
        do {
          out_1 = rdseed();
          cVar10 = rdseedIsValid();
        } while (cVar10 == '\0');
        CSHA512::Write(&startup_hasher,(uchar *)&out_1,8);
      }
    }
    else if ((anonymous_namespace)::g_rdrand_supported == '\x01') {
      for (iVar4 = 0; iVar4 != 4; iVar4 = iVar4 + 1) {
        out_1 = 0;
        iVar9 = 0x400;
        while (bVar2 = iVar9 != 0, iVar9 = iVar9 + -1, bVar2) {
          uVar3 = GetRdRand();
          out_1 = out_1 ^ uVar3;
        }
        CSHA512::Write(&startup_hasher,(uchar *)&out_1,8);
      }
    }
    pRVar7 = this;
    SeedSlow(&startup_hasher,this);
    uVar3 = startup_hasher.bytes;
    LVar5 = (Level)pRVar7;
    RandAddDynamicEnv(&startup_hasher);
    pCVar8 = &startup_hasher;
    RandAddStaticEnv(pCVar8);
    bVar2 = LogAcceptCategory((LogFlags)pCVar8,LVar5);
    if (bVar2) {
      out_1 = startup_hasher.bytes - uVar3;
      logging_function_00._M_str = "SeedStartup";
      logging_function_00._M_len = 0xb;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/random.cpp"
      ;
      source_file_00._M_len = 0x5a;
      LogPrintFormatInternal<unsigned_long>
                (logging_function_00,source_file_00,0x271,RAND,Debug,
                 (ConstevalFormatString<1U>)0x24c277,&out_1);
    }
    SeedStrengthen(&startup_hasher,this,(duration)0x5f5e100);
    RNGState::MixExtract(this,out,(long)num,&startup_hasher,true,always_use_real_rng);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ProcRand(unsigned char* out, int num, RNGLevel level, bool always_use_real_rng) noexcept
{
    // Make sure the RNG is initialized first (as all Seed* function possibly need hwrand to be available).
    RNGState& rng = GetRNGState();

    assert(num <= 32);

    CSHA512 hasher;
    switch (level) {
    case RNGLevel::FAST:
        SeedFast(hasher);
        break;
    case RNGLevel::SLOW:
        SeedSlow(hasher, rng);
        break;
    case RNGLevel::PERIODIC:
        SeedPeriodic(hasher, rng);
        break;
    }

    // Combine with and update state
    if (!rng.MixExtract(out, num, std::move(hasher), false, always_use_real_rng)) {
        // On the first invocation, also seed with SeedStartup().
        CSHA512 startup_hasher;
        SeedStartup(startup_hasher, rng);
        rng.MixExtract(out, num, std::move(startup_hasher), true, always_use_real_rng);
    }
}